

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

ObjectPtr __thiscall ICM::DefFunc::Lists::Foreach::func(Foreach *this,DataList *list)

{
  long lVar1;
  long *plVar2;
  Object *pOVar3;
  size_t sVar4;
  DataObject<(ICM::DefaultType)17> *this_00;
  undefined8 uVar5;
  unsigned_long i;
  long lVar6;
  long *in_RDX;
  ulong uVar7;
  ulong uVar8;
  FuncTableUnit *ftu;
  pointer pFVar9;
  DataList ldl;
  vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> dls;
  T local_80;
  DataList local_68;
  Object *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  ftu = (FuncTableUnit *)(**(long **)(*(long *)in_RDX[1] + 8) * 0x78 + GlobalFunctionTable._8_8_);
  local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(Static + 0x40);
  local_50 = (Object *)this;
  Common::lightlist<ICM::Object*>::lightlist<ICM::Object*const*>
            ((lightlist<ICM::Object*> *)&local_68,(Object **)&local_80,
             (Object **)
             &local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  sVar4 = getCallID(ftu,&local_68);
  if (local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  lVar1 = *in_RDX;
  plVar2 = *(long **)(*(long *)(in_RDX[1] + 8) + 8);
  uVar7 = plVar2[1] - *plVar2 >> 3;
  if (lVar1 != 1) {
    lVar6 = 1;
    do {
      plVar2 = *(long **)(*(long *)(in_RDX[1] + lVar6 * 8) + 8);
      uVar8 = plVar2[1] - *plVar2 >> 3;
      if (uVar8 < uVar7) {
        uVar7 = uVar8;
      }
      lVar6 = lVar6 + 1;
    } while (lVar1 != lVar6);
  }
  pFVar9 = (ftu->func).
           super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>
           ._M_impl.super__Vector_impl_data._M_start + sVar4;
  local_68._capacity = 0;
  local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (Object **)0x0;
  local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (uVar7 != 0) {
    local_48 = lVar1 * 8 - 8;
    uVar8 = 0;
    do {
      local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(lVar1 + -1);
      local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)malloc(local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ICM::Object**,void(*)(ICM::Object**),std::allocator<void>,void>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,Common::Memory::free<ICM::Object*>);
      if (lVar1 != 1) {
        lVar6 = 0;
        do {
          local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
          super__Vector_impl_data._M_finish[lVar6] =
               *(Object **)(**(long **)(*(long *)(in_RDX[1] + 8 + lVar6 * 8) + 8) + uVar8 * 8);
          lVar6 = lVar6 + 1;
        } while ((pointer)(lVar1 + -1) != (pointer)lVar6);
      }
      if ((pFVar9->func).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar5 = std::__throw_bad_function_call();
        if (local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.data.
                          super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.data.
                                super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.data.
                                super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        operator_delete(in_RDX,0x10);
        if ((void *)local_68._capacity != (void *)0x0) {
          operator_delete((void *)local_68._capacity,
                          (long)local_68._data.
                                super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi - local_68._capacity);
        }
        _Unwind_Resume(uVar5);
      }
      (*(pFVar9->func)._M_invoker)((_Any_data *)local_40,(lightlist<ICM::Object_*> *)pFVar9);
      local_40._8_8_ = local_40._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi) {
        std::vector<ICM::Object*,std::allocator<ICM::Object*>>::_M_realloc_insert<ICM::Object*>
                  ((vector<ICM::Object*,std::allocator<ICM::Object*>> *)&local_68,
                   (iterator)
                   local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(Object **)((long)local_40 + 8));
      }
      else {
        *local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type)local_40._0_8_;
        local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_68._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
        ;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  this_00 = (DataObject<(ICM::DefaultType)17> *)operator_new(0x10);
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::vector
            (&local_80.data,(vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&local_68);
  Objects::DataObject<(ICM::DefaultType)17>::DataObject(this_00,&local_80);
  if (local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.data.
                          super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.data.
                          super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar3 = local_50;
  local_50->type = (TypeUnit)this_00;
  if ((void *)local_68._capacity != (void *)0x0) {
    operator_delete((void *)local_68._capacity,
                    (long)local_68._data.
                          super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi - local_68._capacity);
  }
  return (ObjectPtr)pOVar3;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					// TODO
					auto &func = list[0]->get<T_Function>()->getData();
					size_t id = getCallID(func, DataList({ &Static.Zero }));
					const auto &rf = func[id];

					size_t minsize = list[1]->get<T_List>()->size();
					size_t size = list.size();
					for (auto i : range(1, size))
						minsize = std::min(minsize, list[i]->get<T_List>()->size());
					vector<Object*> dls;
					Object obj;
					for (size_t i : range(0, minsize)) {
						DataList ldl(size - 1);
						for (auto id : range(1, size))
							ldl[id - 1] = list[id]->get<T_List>()->getData()[i];
						dls.push_back(rf.call(ldl).get());
					}
					List *result = new List(ListType(dls));
					return ObjectPtr(result);
				}